

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void handle_left(sockaddr_in addr_from)

{
  uint uVar1;
  undefined8 uVar2;
  uchar auVar3 [8];
  const_iterator cVar4;
  mapped_type *pmVar5;
  ulong __n;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar6;
  Ip_Port ip_port;
  int id;
  char str_addr [1000];
  key_type local_428;
  sockaddr_in local_420;
  mapped_type local_40c;
  char local_408 [1000];
  
  uVar1 = *(uint *)((long)buf + 8);
  __n = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
  strncpy(local_408,(char *)((long)buf + 0xc),__n);
  uVar2 = addr_from._0_8_;
  auVar3 = addr_from.sin_zero;
  if (local_408[0] != '0') {
    local_408[__n] = '\0';
    parse_address(local_408,&local_420);
    uVar2 = local_420._0_8_;
    auVar3 = local_420.sin_zero;
  }
  local_420.sin_zero = auVar3;
  local_420._0_8_ = uVar2;
  local_428.first = local_420.sin_addr.s_addr;
  local_428.second = local_420.sin_port;
  cVar4 = std::
          _Rb_tree<std::pair<unsigned_int,_unsigned_short>,_std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>,_std::_Select1st<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
          ::find(&idconnections._M_t,&local_428);
  if ((_Rb_tree_header *)cVar4._M_node == &idconnections._M_t._M_impl.super__Rb_tree_header) {
    handle_left();
  }
  else {
    pmVar5 = std::
             map<std::pair<unsigned_int,_unsigned_short>,_int,_std::less<std::pair<unsigned_int,_unsigned_short>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_short>,_int>_>_>
             ::operator[](&idconnections,&local_428);
    local_40c = *pmVar5;
    pVar6 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            equal_range(&children._M_t,&local_40c);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
              (&children._M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node);
  }
  return;
}

Assistant:

void handle_left(struct sockaddr_in addr_from) {
    size_t size_addr = ntohl(((uint32_t*)buf)[2]);
    char str_addr[ADDRESS_MAX_SIZE];
    strncpy(str_addr, (char*)buf + 3 * sizeof(int), size_addr);

    struct sockaddr_in addr;
    if (str_addr[0] == '0') {
        addr = addr_from;
    }
    else {
        str_addr[size_addr] = '\0';
        parse_address(str_addr, addr);
    }

    Ip_Port ip_port = get_ip_port(addr);
    if (idconnections.count(ip_port)) {
        int id = idconnections[ip_port];
        children.erase(id);
    }
    else {
        fprintf(stderr, "Already left\n");
    }
}